

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_utils.cpp
# Opt level: O3

void CS248::checkGLError(string *str,bool abort_program_if_error)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *__s;
  size_t sVar4;
  
  iVar1 = glGetError();
  iVar2 = iVar1;
  if (iVar1 != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"*** GL error:",0xd);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(str->_M_dataplus)._M_p,str->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," : ",3);
      __s = (char *)gluErrorString(iVar2);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      iVar2 = glGetError();
    } while (iVar2 != 0);
    if (abort_program_if_error && iVar1 != 0) {
      exit(1);
    }
  }
  return;
}

Assistant:

void checkGLError(const std::string& str, bool abort_program_if_error) {
  GLenum err;
  bool has_error = false;
  do {
    err = glGetError();
    if (err != GL_NO_ERROR) {
       cerr << "*** GL error:" << str << " : " << gluErrorString(err) << endl;
       has_error = true;
	  }
  } while (err != GL_NO_ERROR);
  if (has_error && abort_program_if_error) {
    exit(1);
  }
}